

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

void rationSplitter(QSplitter *splitter,float ratio)

{
  initializer_list<int> args;
  QWidget *pQVar1;
  int iVar2;
  int local_60;
  int local_50;
  int local_4c;
  iterator local_48;
  undefined8 local_40;
  QList<int> local_38;
  int local_20;
  int local_1c;
  int second;
  int first;
  int total;
  float ratio_local;
  QSplitter *splitter_local;
  
  first = (int)ratio;
  _total = splitter;
  iVar2 = QSplitter::orientation();
  if (iVar2 == 1) {
    local_60 = QWidget::width((QWidget *)_total);
  }
  else {
    local_60 = QWidget::height((QWidget *)_total);
  }
  pQVar1 = (QWidget *)_total;
  second = local_60;
  local_50 = (int)((float)local_60 * (float)first);
  local_4c = local_60 - local_50;
  local_48 = &local_50;
  local_40 = 2;
  args._M_len = 2;
  args._M_array = local_48;
  local_20 = local_4c;
  local_1c = local_50;
  QList<int>::QList(&local_38,args);
  QSplitter::setSizes((QList_conflict1 *)pQVar1);
  QList<int>::~QList(&local_38);
  return;
}

Assistant:

void rationSplitter(QSplitter &splitter, float ratio) {
    auto total = splitter.orientation() == Qt::Horizontal ? splitter.width() : splitter.height();
    auto first = (int)(total * ratio);
    auto second = total - first;
    splitter.setSizes({ first, second });
}